

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int I420ToRGB565Matrix(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,
                      uint8_t *src_v,int src_stride_v,uint8_t *dst_rgb565,int dst_stride_rgb565,
                      YuvConstants *yuvconstants,int width,int height)

{
  int iVar1;
  code *pcVar2;
  uint uVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  uint local_50;
  
  auVar5._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar5._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar5._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar5._12_4_ = -(uint)(dst_rgb565 == (uint8_t *)0x0);
  iVar1 = movmskps((int)src_u,auVar5);
  if ((height == 0 || width < 1) || iVar1 != 0) {
    iVar1 = -1;
  }
  else {
    if (height < 0) {
      local_50 = -height;
      dst_rgb565 = dst_rgb565 + ~height * dst_stride_rgb565;
      dst_stride_rgb565 = -dst_stride_rgb565;
    }
    else {
      local_50 = height;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((width & 7U) == 0) {
      pcVar2 = I422ToRGB565Row_SSSE3;
    }
    else {
      pcVar2 = I422ToRGB565Row_Any_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar2 = I422ToRGB565Row_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar4 = I422ToRGB565Row_AVX2;
    }
    else {
      pcVar4 = I422ToRGB565Row_Any_AVX2;
    }
    if (iVar1 == 0) {
      pcVar4 = pcVar2;
    }
    for (uVar3 = 0; local_50 != uVar3; uVar3 = uVar3 + 1) {
      (*pcVar4)(src_y,src_u,src_v,dst_rgb565,yuvconstants,width);
      dst_rgb565 = dst_rgb565 + dst_stride_rgb565;
      src_y = src_y + src_stride_y;
      src_v = src_v + (int)(-(uVar3 & 1) & src_stride_v);
      src_u = src_u + (int)(-(uVar3 & 1) & src_stride_u);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420ToRGB565Matrix(const uint8_t* src_y,
                       int src_stride_y,
                       const uint8_t* src_u,
                       int src_stride_u,
                       const uint8_t* src_v,
                       int src_stride_v,
                       uint8_t* dst_rgb565,
                       int dst_stride_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width,
                       int height) {
  int y;
  void (*I422ToRGB565Row)(const uint8_t* y_buf, const uint8_t* u_buf,
                          const uint8_t* v_buf, uint8_t* rgb_buf,
                          const struct YuvConstants* yuvconstants, int width) =
      I422ToRGB565Row_C;
  if (!src_y || !src_u || !src_v || !dst_rgb565 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb565 = dst_rgb565 + (height - 1) * dst_stride_rgb565;
    dst_stride_rgb565 = -dst_stride_rgb565;
  }
#if defined(HAS_I422TORGB565ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToRGB565Row = I422ToRGB565Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGB565Row = I422ToRGB565Row_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TORGB565ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToRGB565Row = I422ToRGB565Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToRGB565Row = I422ToRGB565Row_AVX2;
    }
  }
#endif
#if defined(HAS_I422TORGB565ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToRGB565Row = I422ToRGB565Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGB565Row = I422ToRGB565Row_NEON;
    }
  }
#endif
#if defined(HAS_I422TORGB565ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToRGB565Row = I422ToRGB565Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToRGB565Row = I422ToRGB565Row_MMI;
    }
  }
#endif
#if defined(HAS_I422TORGB565ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToRGB565Row = I422ToRGB565Row_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToRGB565Row = I422ToRGB565Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422ToRGB565Row(src_y, src_u, src_v, dst_rgb565, yuvconstants, width);
    dst_rgb565 += dst_stride_rgb565;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}